

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  byte bVar1;
  secp256k1_fe *r_00;
  secp256k1_sha256 *hasher_00;
  uchar *a;
  int iVar2;
  secp256k1_fe *b;
  uint32_t cnt;
  uint64_t uVar3;
  long lVar4;
  uint32_t cnt_00;
  uint uVar5;
  secp256k1_fe local_218;
  secp256k1_fe local_1e8;
  uint local_1c0;
  uint local_1bc;
  secp256k1_fe local_1b8;
  secp256k1_fe x;
  secp256k1_fe local_158;
  secp256k1_fe *local_130;
  secp256k1_sha256 *local_128;
  uchar *local_120;
  secp256k1_fe local_118;
  secp256k1_fe local_f0;
  uint64_t local_c8;
  uint64_t uStack_c0;
  uint64_t local_b8;
  uint64_t uStack_b0;
  secp256k1_fe r;
  uchar branch_hash [32];
  secp256k1_fe local_58;
  
  cnt_00 = 0;
  uVar5 = 0;
  local_130 = t;
  local_128 = hasher;
  local_120 = u32;
  do {
    hasher_00 = local_128;
    cnt = cnt_00;
    if (uVar5 == 0) {
      cnt = cnt_00 + 1;
      secp256k1_ellswift_prng(branch_hash,local_128,cnt_00);
      uVar5 = 0x40;
    }
    a = local_120;
    local_1bc = uVar5 - 1;
    bVar1 = branch_hash[local_1bc >> 1] >> ((char)uVar5 * '\x04' - 4U & 4);
    uVar5 = (uint)bVar1;
    secp256k1_ellswift_prng(local_120,hasher_00,cnt);
    secp256k1_fe_impl_set_b32_mod(&local_158,a);
    x.n[4] = (p->x).n[4];
    x.n[0] = (p->x).n[0];
    x.n[1] = (p->x).n[1];
    x.n[2] = (p->x).n[2];
    x.n[3] = (p->x).n[3];
    secp256k1_fe_impl_normalize_weak(&x);
    secp256k1_fe_impl_normalize_weak(&local_158);
    if ((bVar1 & 2) == 0) {
      local_218.n[0] = 0x5ffff9ffffe91a - (local_158.n[0] + x.n[0]);
      local_218.n[1] = 0x5ffffffffffffa - (local_158.n[1] + x.n[1]);
      local_218.n[2] = 0x5ffffffffffffa - (local_158.n[2] + x.n[2]);
      local_218.n[3] = 0x5ffffffffffffa - (local_158.n[3] + x.n[3]);
      local_218.n[4] = 0x5fffffffffffa - (local_158.n[4] + x.n[4]);
      secp256k1_fe_impl_sqr(&local_58,&local_218);
      secp256k1_fe_impl_mul(&local_58,&local_58,&local_218);
      local_58.n[0] = local_58.n[0] + 7;
      iVar2 = secp256k1_fe_impl_is_square_var(&local_58);
      if (iVar2 == 0) {
        secp256k1_fe_impl_sqr(&local_1e8,&local_218);
        uVar3 = local_1e8.n[4];
        secp256k1_fe_impl_mul(&local_218,&local_158,&x);
        local_1e8.n[0] = (local_218.n[0] - local_1e8.n[0]) + 0x3ffffbfffff0bc;
        local_1e8.n[1] = (local_218.n[1] - local_1e8.n[1]) + 0x3ffffffffffffc;
        local_1e8.n[2] = (local_218.n[2] - local_1e8.n[2]) + 0x3ffffffffffffc;
        local_1e8.n[3] = (local_218.n[3] - local_1e8.n[3]) + 0x3ffffffffffffc;
        local_1e8.n[4] = (local_218.n[4] - uVar3) + 0x3fffffffffffc;
        secp256k1_fe_impl_sqr(&local_f0,&local_158);
        secp256k1_fe_impl_mul(&local_f0,&local_f0,&local_158);
        local_f0.n[0] = local_f0.n[0] + 7;
        secp256k1_fe_impl_mul(&local_218,&local_1e8,&local_f0);
        iVar2 = secp256k1_fe_impl_is_square_var(&local_218);
        if (iVar2 != 0) {
          secp256k1_fe_impl_inv_var(&local_1e8,&local_1e8);
          secp256k1_fe_impl_mul(&local_1e8,&local_1e8,&local_f0);
          local_118.n[4] = x.n[4];
          local_118.n[0] = x.n[0];
          local_118.n[1] = x.n[1];
          local_118.n[2] = x.n[2];
          local_118.n[3] = x.n[3];
LAB_0010a148:
          secp256k1_fe_sqrt(&local_218,&local_1e8);
          r_00 = local_130;
          if (((uVar5 & 5) == 5) || ((uVar5 & 5) == 0)) {
            local_218.n[0] = 0x3ffffbfffff0bc - local_218.n[0];
            local_218.n[1] = 0x3ffffffffffffc - local_218.n[1];
            local_218.n[2] = 0x3ffffffffffffc - local_218.n[2];
            local_218.n[3] = 0x3ffffffffffffc - local_218.n[3];
            local_218.n[4] = 0x3fffffffffffc - local_218.n[4];
          }
          b = &secp256k1_ellswift_c4;
          if ((uVar5 & 1) == 0) {
            b = &secp256k1_ellswift_c3;
          }
          secp256k1_fe_impl_mul(&local_158,&local_158,b);
          local_158.n[0] = local_158.n[0] + local_118.n[0];
          local_158.n[1] = local_158.n[1] + local_118.n[1];
          local_158.n[2] = local_158.n[2] + local_118.n[2];
          local_158.n[3] = local_158.n[3] + local_118.n[3];
          local_158.n[4] = local_158.n[4] + local_118.n[4];
          secp256k1_fe_impl_mul(r_00,&local_218,&local_158);
          secp256k1_fe_impl_normalize_var(r_00);
          if ((((uint)(p->y).n[0] ^ (uint)r_00->n[0]) & 1) == 0) {
            return;
          }
          secp256k1_fe_impl_negate_unchecked(r_00,r_00,1);
          secp256k1_fe_impl_normalize_var(r_00);
          return;
        }
      }
    }
    else {
      local_218.n[0] = 0x3ffffbfffff0bc - local_158.n[0];
      local_218.n[1] = 0x3ffffffffffffc - local_158.n[1];
      local_218.n[2] = 0x3ffffffffffffc - local_158.n[2];
      local_218.n[3] = 0x3ffffffffffffc - local_158.n[3];
      uVar3 = 0x3fffffffffffc - local_158.n[4];
      local_1e8.n[0] = local_218.n[0] + x.n[0];
      local_1e8.n[1] = local_218.n[1] + x.n[1];
      local_1e8.n[2] = local_218.n[2] + x.n[2];
      local_1e8.n[3] = local_218.n[3] + x.n[3];
      local_1e8.n[4] = x.n[4] + uVar3;
      local_218.n[4] = uVar3;
      local_c8 = local_218.n[2];
      uStack_c0 = local_218.n[3];
      local_b8 = local_218.n[0];
      uStack_b0 = local_218.n[1];
      iVar2 = secp256k1_fe_impl_is_square_var(&local_1e8);
      if (iVar2 != 0) {
        local_1c0 = uVar5;
        secp256k1_fe_impl_sqr(&local_f0,&local_158);
        secp256k1_fe_impl_mul(&local_1b8,&local_1e8,&local_f0);
        uVar5 = local_1c0;
        lVar4 = local_1b8.n[0] * 3;
        secp256k1_fe_impl_mul(&local_f0,&local_f0,&local_158);
        local_1b8.n[0] = lVar4 + local_f0.n[0] * 4 + 0x1c;
        local_1b8.n[1] = local_f0.n[1] * 4 + local_1b8.n[1] * 3;
        local_1b8.n[2] = local_f0.n[2] * 4 + local_1b8.n[2] * 3;
        local_1b8.n[3] = local_f0.n[3] * 4 + local_1b8.n[3] * 3;
        local_1b8.n[4] = local_f0.n[4] * 4 + local_1b8.n[4] * 3;
        secp256k1_fe_impl_mul(&local_1b8,&local_1b8,&local_1e8);
        local_1b8.n[0] = 0x3ffffbfffff0bc - local_1b8.n[0];
        local_1b8.n[1] = 0x3ffffffffffffc - local_1b8.n[1];
        local_1b8.n[2] = 0x3ffffffffffffc - local_1b8.n[2];
        local_1b8.n[3] = 0x3ffffffffffffc - local_1b8.n[3];
        local_1b8.n[4] = 0x3fffffffffffc - local_1b8.n[4];
        iVar2 = secp256k1_fe_impl_is_square_var(&local_1b8);
        if (iVar2 != 0) {
          secp256k1_fe_sqrt(&r,&local_1b8);
          if ((uVar5 & 1) != 0) {
            iVar2 = secp256k1_fe_impl_normalizes_to_zero_var(&r);
            if (iVar2 != 0) goto LAB_0010a0dc;
          }
          iVar2 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1e8);
          if (iVar2 == 0) {
            secp256k1_fe_impl_inv_var(&local_118,&local_1e8);
            secp256k1_fe_impl_mul(&local_118,&local_118,&r);
            local_118.n[0] = local_b8 + local_118.n[0];
            local_118.n[1] = uStack_b0 + local_118.n[1];
            local_118.n[2] = local_c8 + local_118.n[2];
            local_118.n[3] = uStack_c0 + local_118.n[3];
            local_118.n[4] = local_118.n[4] + uVar3;
            secp256k1_fe_impl_half(&local_118);
            goto LAB_0010a148;
          }
        }
      }
    }
LAB_0010a0dc:
    cnt_00 = cnt + 1;
    uVar5 = local_1bc;
  } while( true );
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}